

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsecpp.cpp
# Opt level: O0

int non_whitespace(QString *content,int pos)

{
  bool bVar1;
  long lVar2;
  qsizetype qVar3;
  bool local_41;
  QChar local_32;
  QChar local_30;
  QChar local_2e;
  QChar local_2c;
  QChar local_2a;
  QChar local_28;
  QChar local_26;
  QChar local_24;
  undefined1 local_21;
  int local_20;
  int iStack_1c;
  bool ws;
  int i;
  int pos_local;
  QString *content_local;
  
  local_20 = pos;
  iStack_1c = pos;
  _i = content;
  while( true ) {
    lVar2 = (long)local_20;
    qVar3 = QString::size(_i);
    if (qVar3 <= lVar2) {
      return -1;
    }
    local_24 = QString::operator[](_i,(long)local_20);
    QChar::QChar(&local_26,' ');
    bVar1 = operator==(local_24,local_26);
    local_41 = true;
    if (!bVar1) {
      local_28 = QString::operator[](_i,(long)local_20);
      QChar::QChar(&local_2a,'\t');
      bVar1 = operator==(local_28,local_2a);
      local_41 = true;
      if (!bVar1) {
        local_2c = QString::operator[](_i,(long)local_20);
        QChar::QChar(&local_2e,'\r');
        bVar1 = operator==(local_2c,local_2e);
        local_41 = true;
        if (!bVar1) {
          local_30 = QString::operator[](_i,(long)local_20);
          QChar::QChar(&local_32,'\n');
          local_41 = operator==(local_30,local_32);
        }
      }
    }
    local_21 = local_41;
    if (local_41 == false) break;
    local_20 = local_20 + 1;
  }
  return local_20;
}

Assistant:

int non_whitespace(const QString& content, int pos) {
    for(int i=pos;i<content.size();i++) {
        bool ws = content[i] == ' '
                || content[i] == '\t'
                || content[i] == '\r'
                || content[i] == '\n';
        if (!ws) {
            return i;
        }
    }
    return -1;
}